

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_ctor_iterator(void)

{
  size_type *this;
  bool bVar1;
  iterator begin;
  iterator end;
  undefined4 local_54;
  size_type local_50;
  undefined4 local_44;
  size_type local_40 [2];
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  this = &span.member.next;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)this);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)this);
  vista::circular_view<int,4ul>::circular_view<int*>((circular_view<int,4ul> *)local_30,begin,end);
  bVar1 = vista::circular_view<int,_4UL>::empty((circular_view<int,_4UL> *)local_30);
  boost::detail::test_impl
            ("span.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x318,"void api_fixed_suite::fixed_ctor_iterator()",bVar1);
  bVar1 = vista::circular_view<int,_4UL>::full((circular_view<int,_4UL> *)local_30);
  boost::detail::test_impl
            ("!span.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x319,"void api_fixed_suite::fixed_ctor_iterator()",(bool)(bVar1 - 1U & 1));
  local_40[0] = vista::circular_view<int,_4UL>::size((circular_view<int,_4UL> *)local_30);
  local_44 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x31a,"void api_fixed_suite::fixed_ctor_iterator()",local_40,&local_44);
  local_50 = vista::circular_view<int,_4UL>::capacity((circular_view<int,_4UL> *)local_30);
  local_54 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x31b,"void api_fixed_suite::fixed_ctor_iterator()",&local_50,&local_54);
  return;
}

Assistant:

void fixed_ctor_iterator()
{
    std::array<int, 4> array = {};
    circular_view<int, 4> span(array.begin(), array.end());
    BOOST_TEST(span.empty());
    BOOST_TEST(!span.full());
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.capacity(), 4);
}